

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O3

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::happens_after
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *identifier)

{
  shared_mutex *__rwlock;
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  size_t hash;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
  *this_00;
  ThreadState *thr;
  iterator iVar5;
  void *local_78;
  void *local_70;
  _Head_base<0UL,_void_*&,_false> local_68;
  tuple<> local_60 [8];
  pair<phmap::container_internal::parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>::iterator,_bool>
  local_58;
  
  __rwlock = &this->g_lock;
  local_78 = identifier;
  iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar2 != 0x23) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = identifier;
    hash = SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
           SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0);
    uVar3 = (((uint)(hash >> 4) & 0xfffffff ^ (uint)hash) & 0xf) << 6;
    this_00 = (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
               *)((long)&(this->happens_states).
                         super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                         .
                         super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                         .sets_._M_elems[0].set_.ctrl_ + (ulong)uVar3);
    iVar5 = phmap::container_internal::
            raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
            ::find<void*>(this_00,&local_78,hash);
    if ((ctrl_t *)
        (*(long *)this_00 +
        *(long *)((long)&(this->happens_states).
                         super_parallel_hash_map<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                         .
                         super_parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                         .sets_._M_elems[0].set_.capacity_ + (ulong)uVar3)) == iVar5.ctrl_) {
      local_68._M_head_impl = &local_70;
      local_70 = local_78;
      phmap::container_internal::
      parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
      ::
      emplace_decomposable<void*,std::piecewise_construct_t_const&,std::tuple<void*&>,std::tuple<>>
                (&local_58,&this->happens_states,local_68._M_head_impl,
                 (piecewise_construct_t *)&std::piecewise_construct,(tuple<void_*&> *)&local_68,
                 local_60);
    }
    else {
      VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
                ((VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)tls
                 ,(VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)
                  ((long)iVar5.field_1.slot_ + 8));
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    return;
  }
  uVar4 = std::__throw_system_error(0x23);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  _Unwind_Resume(uVar4);
}

Assistant:

void happens_after(tls_t tls, void* identifier) final {
    {
      std::lock_guard<LockT> exLockT(g_lock);
      auto it = happens_states.find(identifier);
      if (it == happens_states.end()) {
        create_happens(identifier);
        return;  // create -> no happens_before can be synced
      } else {
        ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
        // update vector clock of thread with happened before clocks
        thr->update(it->second);
      }
    }
  }